

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::FinalizeObject(markerType *marker,char *base)

{
  uint uVar4;
  ExternTypeInfo *pEVar1;
  ulong uVar2;
  int iVar3;
  bool bVar5;
  NULLCRef r;
  
  uVar4 = (uint)*marker;
  if ((*marker & 0x10) == 0) {
    r.typeID = uVar4 >> 8;
    r.ptr = base + 8;
    FastVector<NULLCRef,_false,_false>::push_back
              ((FastVector<NULLCRef,_false,_false> *)&finalizeList,&r);
  }
  else {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),uVar4 >> 8);
    uVar4._0_1_ = pEVar1->defaultAlign;
    uVar4._1_1_ = pEVar1->typeFlags;
    uVar4._2_2_ = pEVar1->pointerCount;
    uVar2 = 4;
    if (4 < (byte)(undefined1)uVar4) {
      uVar2 = (ulong)uVar4;
    }
    r.ptr = base + (uVar2 & 0xff) + 8;
    iVar3 = *(int *)(base + (uVar2 & 0xff) + 4);
    r.typeID = (uint)*marker >> 8;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      FastVector<NULLCRef,_false,_false>::push_back
                ((FastVector<NULLCRef,_false,_false> *)&finalizeList,&r);
      r.ptr = r.ptr + pEVar1->size;
    }
  }
  *(byte *)marker = (byte)*marker | 8;
  return;
}

Assistant:

void FinalizeObject(markerType& marker, char* base)
	{
		if(marker & NULLC::OBJECT_ARRAY)
		{
			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) + arrayPadding }; // skip over marker and array size

			for(unsigned i = 0; i < count; i++)
			{
				NULLC::finalizeList.push_back(r);
				r.ptr += typeInfo.size;
			}
		}
		else
		{
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) }; // skip over marker
			NULLC::finalizeList.push_back(r);
		}
		marker |= NULLC::OBJECT_FINALIZED;
	}